

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

bool __thiscall
slang::CommandLine::parse(CommandLine *this,string_view argList,ParseOptions options)

{
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> args_00;
  bool bVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar3;
  bool hasArg;
  string current;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL> args;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  storage;
  bool local_211;
  basic_string_view<char,_std::char_traits<char>_> local_210;
  string local_200;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL> local_1e0;
  SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148 [5];
  
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_200._M_string_length = 0;
  local_211 = false;
  local_200.field_2._M_local_buf[0] = '\0';
  local_148[0].data_ = (pointer)local_148[0].firstElement;
  local_148[0].len = 0;
  local_148[0].cap = 8;
  parseStr(this,argList,options,&local_211,&local_200,local_148);
  if (local_211 == true) {
    SmallVectorBase<std::__cxx11::string>::emplace_back<std::__cxx11::string>
              ((SmallVectorBase<std::__cxx11::string> *)local_148,&local_200);
  }
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL>::SmallVector
            (&local_1e0,local_148[0].len);
  pbVar3 = local_148[0].data_;
  for (lVar2 = local_148[0].len << 5; lVar2 != 0; lVar2 = lVar2 + -0x20) {
    local_210._M_str = (pbVar3->_M_dataplus)._M_p;
    local_210._M_len = pbVar3->_M_string_length;
    SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              ((SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)&local_1e0,
               &local_210);
    pbVar3 = pbVar3 + 1;
  }
  args_00._M_extent._M_extent_value =
       local_1e0.super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>.len;
  args_00._M_ptr =
       local_1e0.super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>.data_
  ;
  bVar1 = parse(this,args_00,options);
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::cleanup
            (&local_1e0.
              super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>,
             (EVP_PKEY_CTX *)
             local_1e0.super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>
             .data_);
  SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::cleanup(local_148,
            (EVP_PKEY_CTX *)
            local_1e0.super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>.
            data_);
  std::__cxx11::string::~string((string *)&local_200);
  return bVar1;
}

Assistant:

bool CommandLine::parse(std::string_view argList, ParseOptions options) {
    bool hasArg = false;
    std::string current;
    SmallVector<std::string, 8> storage;

    parseStr(argList, options, hasArg, current, storage);

    if (hasArg)
        storage.emplace_back(std::move(current));

    SmallVector<std::string_view, 8> args(storage.size(), UninitializedTag());
    for (auto& arg : storage)
        args.push_back(arg);

    return parse(args, options);
}